

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidArgsortWrongAxis(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  Tensor *this;
  string *psVar4;
  long lVar5;
  ostream *poVar6;
  Result local_e0;
  Result local_b0;
  ArgSortLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *local_48;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  outShape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)outShape,"output");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)outShape);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,2);
  layers = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)layers,EXACT_ARRAY_MAPPING);
  params = (ArgSortLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)layers);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)params,"argsort");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"output");
  this = CoreML::Specification::NeuralNetworkLayer::add_inputtensor((NeuralNetworkLayer *)params);
  CoreML::Specification::Tensor::set_rank(this,3);
  local_b0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_argsort((NeuralNetworkLayer *)params);
  CoreML::Specification::ArgSortLayerParams::set_axis
            ((ArgSortLayerParams *)local_b0.m_message._M_storage._M_storage,-1);
  CoreML::validate<(MLModelType)500>(&local_b0,(Model *)&in);
  bVar1 = CoreML::Result::good(&local_b0);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1752);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar4 = CoreML::Result::message_abi_cxx11_(&local_b0);
    lVar5 = std::__cxx11::string::find((char *)psVar4,0x43c954);
    if (lVar5 == -1) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1753);
      poVar6 = std::operator<<(poVar6,": error: ");
      poVar6 = std::operator<<(poVar6,"res.message().find(\"axis\") != std::string::npos");
      poVar6 = std::operator<<(poVar6," was false, expected true.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      CoreML::Specification::ArgSortLayerParams::set_axis
                ((ArgSortLayerParams *)local_b0.m_message._M_storage._M_storage,3);
      CoreML::validate<(MLModelType)500>(&local_e0,(Model *)&in);
      CoreML::Result::operator=(&local_b0,&local_e0);
      CoreML::Result::~Result(&local_e0);
      bVar1 = CoreML::Result::good(&local_b0);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1758);
        poVar6 = std::operator<<(poVar6,": error: ");
        poVar6 = std::operator<<(poVar6,"!((res).good())");
        poVar6 = std::operator<<(poVar6," was false, expected true.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
      else {
        psVar4 = CoreML::Result::message_abi_cxx11_(&local_b0);
        lVar5 = std::__cxx11::string::find((char *)psVar4,0x43c954);
        if (lVar5 == -1) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar6 = std::operator<<(poVar6,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1759);
          poVar6 = std::operator<<(poVar6,": error: ");
          poVar6 = std::operator<<(poVar6,"res.message().find(\"axis\") != std::string::npos");
          poVar6 = std::operator<<(poVar6," was false, expected true.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
        }
        else {
          m._oneof_case_[0] = 0;
        }
      }
    }
  }
  local_e0.m_message._M_storage._M_storage[4] = '\x01';
  local_e0.m_message._M_storage._M_storage[5] = '\0';
  local_e0.m_message._M_storage._M_storage[6] = '\0';
  local_e0.m_message._M_storage._M_storage[7] = '\0';
  CoreML::Result::~Result(&local_b0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidArgsortWrongAxis() {

    // axis can't be negative or larger than equal to input rank

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->set_name("argsort");
    layers->add_input("input");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_argsort();

    // CASE 1: negative axis
    params->set_axis(-1);

    // axis should be in range [0, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    // CASE 2: axis greater than equal to input rank
    params->set_axis(3);
    res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;
}